

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int psbt_output_free(wally_psbt_output *output,_Bool free_parent)

{
  int in_EAX;
  int extraout_EAX;
  
  if (output != (wally_psbt_output *)0x0) {
    clear_and_free(output->redeem_script,output->redeem_script_len);
    clear_and_free(output->witness_script,output->witness_script_len);
    wally_map_clear(&output->keypaths);
    wally_map_clear(&output->unknowns);
    clear_and_free(output->blinding_pubkey,output->blinding_pubkey_len);
    clear_and_free(output->value_commitment,output->value_commitment_len);
    clear_and_free(output->vbf,output->vbf_len);
    clear_and_free(output->asset_commitment,output->asset_commitment_len);
    clear_and_free(output->abf,output->abf_len);
    clear_and_free(output->nonce,output->nonce_len);
    clear_and_free(output->rangeproof,output->rangeproof_len);
    clear_and_free(output->surjectionproof,output->surjectionproof_len);
    wally_clear(output,0xd0);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int psbt_output_free(struct wally_psbt_output *output, bool free_parent)
{
    if (output) {
        clear_and_free(output->redeem_script, output->redeem_script_len);
        clear_and_free(output->witness_script, output->witness_script_len);
        wally_map_clear(&output->keypaths);
        wally_map_clear(&output->unknowns);

#ifdef BUILD_ELEMENTS
        clear_and_free(output->blinding_pubkey, output->blinding_pubkey_len);
        clear_and_free(output->value_commitment, output->value_commitment_len);
        clear_and_free(output->vbf, output->vbf_len);
        clear_and_free(output->asset_commitment, output->asset_commitment_len);
        clear_and_free(output->abf, output->abf_len);
        clear_and_free(output->nonce, output->nonce_len);
        clear_and_free(output->rangeproof, output->rangeproof_len);
        clear_and_free(output->surjectionproof, output->surjectionproof_len);
#endif /* BUILD_ELEMENTS */

        wally_clear(output, sizeof(*output));
        if (free_parent)
            wally_free(output);
    }
    return WALLY_OK;
}